

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

void nn_process_option(nn_parse_context *ctx,int opt_index,char *argument)

{
  ulong uVar1;
  undefined4 uVar2;
  FILE *__stream;
  void *pvVar3;
  size_t sVar4;
  void *pvVar5;
  nn_option *pnVar6;
  int *piVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  FILE *__stream_00;
  long *plVar11;
  long lVar12;
  nn_enum_item *items;
  size_t sVar13;
  long *plVar14;
  size_t sVar15;
  ulong uVar16;
  bool bVar17;
  float fVar18;
  char *endptr;
  
  if ((ctx->options[opt_index].conflicts_mask & ctx->mask) != 0) {
    fprintf(_stderr,"%s: Option",*ctx->argv);
    nn_print_option(ctx,opt_index,(FILE *)_stderr);
    fwrite("conflicts with the following options:\n",0x26,1,_stderr);
    pnVar6 = ctx->options;
    uVar1 = pnVar6[opt_index].conflicts_mask;
    uVar16 = 0;
    iVar9 = 0;
    for (lVar12 = 0; *(long *)((long)&pnVar6->longname + lVar12) != 0; lVar12 = lVar12 + 0x58) {
      if ((((uint)opt_index != uVar16) && (ctx->last_option_usage[uVar16] != (char *)0x0)) &&
         ((*(ulong *)((long)&pnVar6->mask_set + lVar12) & uVar1) != 0)) {
        iVar9 = iVar9 + 1;
        fwrite("   ",3,1,_stderr);
        nn_print_option(ctx,(int)uVar16,(FILE *)_stderr);
        fputc(10,_stderr);
        pnVar6 = ctx->options;
      }
      uVar16 = uVar16 + 1;
    }
    if (iVar9 == 0) {
      fwrite("   ",3,1,_stderr);
      nn_print_option(ctx,opt_index,(FILE *)_stderr);
      fputc(10,_stderr);
    }
    goto LAB_00104a0c;
  }
  pnVar6 = ctx->options + opt_index;
  ctx->mask = ctx->mask | pnVar6->mask_set;
  switch(pnVar6->type) {
  case NN_OPT_HELP:
    nn_print_help(ctx,_stdout);
    exit(0);
  case NN_OPT_INT:
    lVar12 = strtol(argument,&endptr,0);
    *(long *)((long)ctx->target + (long)pnVar6->offset) = lVar12;
    if ((endptr != argument) && (*endptr == '\0')) {
      return;
    }
    pcVar8 = "requires integer argument";
    goto LAB_00104707;
  case NN_OPT_INCREMENT:
    piVar7 = (int *)((long)ctx->target + (long)pnVar6->offset);
    *piVar7 = *piVar7 + 1;
    break;
  case NN_OPT_DECREMENT:
    piVar7 = (int *)((long)ctx->target + (long)pnVar6->offset);
    *piVar7 = *piVar7 + -1;
    break;
  case NN_OPT_ENUM:
    goto switchD_00104629_caseD_4;
  case NN_OPT_SET_ENUM:
    uVar2 = *pnVar6->pointer;
LAB_00104901:
    *(undefined4 *)((long)ctx->target + (long)pnVar6->offset) = uVar2;
    break;
  case NN_OPT_STRING:
    *(char **)((long)ctx->target + (long)pnVar6->offset) = argument;
    break;
  case NN_OPT_BLOB:
    pvVar3 = ctx->target;
    lVar12 = (long)pnVar6->offset;
    *(char **)((long)pvVar3 + lVar12) = argument;
    sVar13 = strlen(argument);
    *(int *)((long)pvVar3 + lVar12 + 8) = (int)sVar13;
    *(undefined4 *)((long)pvVar3 + lVar12 + 0xc) = 0;
    break;
  case NN_OPT_FLOAT:
    fVar18 = strtof(argument,&endptr);
    *(float *)((long)ctx->target + (long)pnVar6->offset) = fVar18;
    if ((endptr != argument) && (*endptr == '\0')) {
      return;
    }
    pcVar8 = "requires float point argument";
LAB_00104707:
    nn_option_error(pcVar8,ctx,opt_index);
switchD_00104629_caseD_4:
    plVar14 = (long *)pnVar6->pointer;
    for (plVar11 = plVar14 + 1; (char *)plVar11[-1] != (char *)0x0; plVar11 = plVar11 + 2) {
      iVar9 = strcmp((char *)plVar11[-1],argument);
      if (iVar9 == 0) {
        uVar2 = (undefined4)*plVar11;
        goto LAB_00104901;
      }
    }
    fprintf(_stderr,"%s: Invalid value ``%s\'\' for",*ctx->argv,argument);
    nn_print_option(ctx,opt_index,(FILE *)_stderr);
    fwrite(". Options are:\n",0xf,1,_stderr);
    for (; *plVar14 != 0; plVar14 = plVar14 + 2) {
      fprintf(_stderr,"    %s\n");
    }
LAB_00104a0c:
    iVar9 = 1;
LAB_00104a0e:
    exit(iVar9);
  case NN_OPT_LIST_APPEND:
    nn_append_string(ctx,pnVar6,argument);
    return;
  case NN_OPT_LIST_APPEND_FMT:
    sVar13 = strlen(argument);
    pcVar8 = (char *)pnVar6->pointer;
    sVar15 = strlen(pcVar8);
    sVar15 = sVar15 + sVar13;
    pcVar10 = (char *)malloc(sVar15);
    iVar9 = snprintf(pcVar10,sVar15,pcVar8,argument);
    if (sVar15 <= (ulong)(long)iVar9) goto LAB_00104acf;
    nn_append_string(ctx,pnVar6,pcVar10);
    pvVar3 = ctx->target;
    lVar12 = (long)pnVar6->offset;
    if (*(long *)((long)pvVar3 + lVar12 + 8) == 0) {
      pvVar5 = malloc(8);
      *(undefined4 *)((long)pvVar3 + lVar12 + 0x14) = 1;
    }
    else {
      iVar9 = *(int *)((long)pvVar3 + lVar12 + 0x14);
      *(int *)((long)pvVar3 + lVar12 + 0x14) = iVar9 + 1;
      pvVar5 = realloc(*(void **)((long)pvVar3 + lVar12),(long)iVar9 * 8 + 8);
    }
    *(void **)((long)pvVar3 + lVar12 + 8) = pvVar5;
    if (*(long *)((long)pvVar3 + lVar12) != 0) {
      *(char **)((long)pvVar5 + (long)*(int *)((long)pvVar3 + lVar12 + 0x14) * 8 + -8) = pcVar10;
      return;
    }
    goto LAB_00104ac7;
  case NN_OPT_READ_FILE:
    if (((*argument != '-') || (__stream = _stdin, argument[1] != '\0')) &&
       (__stream = fopen(argument,"r"), __stream_00 = _stderr, __stream == (FILE *)0x0)) {
      piVar7 = __errno_location();
      pcVar8 = strerror(*piVar7);
      pcVar10 = "Error opening file ``%s\'\': %s\n";
LAB_00104b56:
      fprintf(__stream_00,pcVar10,argument,pcVar8);
      iVar9 = 2;
      goto LAB_00104a0e;
    }
    sVar13 = 0x1000;
    pvVar3 = malloc(0x1000);
    if (pvVar3 != (void *)0x0) {
      sVar15 = 0;
      do {
        do {
          sVar4 = fread((void *)(sVar15 + (long)pvVar3),1,sVar13 - sVar15,__stream);
          sVar15 = (long)(int)sVar4 + sVar15;
          iVar9 = feof(__stream);
          if (iVar9 != 0) {
            if ((sVar13 != sVar15) && (pvVar3 = realloc(pvVar3,sVar15), pvVar3 == (void *)0x0)) {
              __assert_fail("data",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tools/options.c"
                            ,499,"void nn_process_option(struct nn_parse_context *, int, char *)");
            }
            iVar9 = ferror(__stream);
            __stream_00 = _stderr;
            if (iVar9 == 0) {
              if (__stream != _stdin) {
                fclose(__stream);
              }
              pvVar5 = ctx->target;
              lVar12 = (long)pnVar6->offset;
              *(void **)((long)pvVar5 + lVar12) = pvVar3;
              *(int *)((long)pvVar5 + lVar12 + 8) = (int)sVar15;
              *(undefined4 *)((long)pvVar5 + lVar12 + 0xc) = 1;
              return;
            }
            piVar7 = __errno_location();
            pcVar8 = strerror(*piVar7);
            pcVar10 = "Error reading file ``%s\'\': %s\n";
            goto LAB_00104b56;
          }
        } while (0x3ff < sVar13 - sVar15);
        sVar4 = sVar13 * 2;
        bVar17 = sVar13 < 0x100000;
        sVar13 = sVar13 + 0x100000;
        if (bVar17) {
          sVar13 = sVar4;
        }
        pvVar3 = realloc(pvVar3,sVar13);
      } while (pvVar3 != (void *)0x0);
    }
LAB_00104ac7:
    nn_memory_error(ctx);
LAB_00104acf:
    __assert_fail("data_len < data_buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tools/options.c"
                  ,0x1cc,"void nn_process_option(struct nn_parse_context *, int, char *)");
  default:
    abort();
  }
  return;
}

Assistant:

static void nn_process_option (struct nn_parse_context *ctx,
                              int opt_index, char *argument)
{
    struct nn_option *opt;
    struct nn_enum_item *items;
    char *endptr;
    struct nn_blob *blob;
    FILE *file;
    char *data;
    size_t data_len;
    size_t data_buf;
    int bytes_read;

    opt = &ctx->options[opt_index];
    if (ctx->mask & opt->conflicts_mask) {
        nn_option_conflict (ctx, opt_index);
    }
    ctx->mask |= opt->mask_set;

    switch (opt->type) {
        case NN_OPT_HELP:
            nn_print_help (ctx, stdout);
            exit (0);
            return;
        case NN_OPT_INT:
            *(long *)(((char *)ctx->target) + opt->offset) = strtol (argument,
                &endptr, 0);
            if (endptr == argument || *endptr != 0) {
                nn_option_error ("requires integer argument",
                                ctx, opt_index);
            }
            return;
        case NN_OPT_INCREMENT:
            *(int *)(((char *)ctx->target) + opt->offset) += 1;
            return;
        case NN_OPT_DECREMENT:
            *(int *)(((char *)ctx->target) + opt->offset) -= 1;
            return;
        case NN_OPT_ENUM:
            items = (struct nn_enum_item *)opt->pointer;
            for (;items->name; ++items) {
                if (!strcmp (items->name, argument)) {
                    *(int *)(((char *)ctx->target) + opt->offset) = \
                        items->value;
                    return;
                }
            }
            nn_invalid_enum_value (ctx, opt_index, argument);
            return;
        case NN_OPT_SET_ENUM:
            *(int *)(((char *)ctx->target) + opt->offset) = \
                *(int *)(opt->pointer);
            return;
        case NN_OPT_STRING:
            *(char **)(((char *)ctx->target) + opt->offset) = argument;
            return;
        case NN_OPT_BLOB:
            blob = (struct nn_blob *)(((char *)ctx->target) + opt->offset);
            blob->data = argument;
            blob->length = strlen (argument);
            blob->need_free = 0;
            return;
        case NN_OPT_FLOAT:
#if defined NN_HAVE_WINDOWS
            *(float *)(((char *)ctx->target) + opt->offset) =
                (float) atof (argument);
#else
            *(float *)(((char *)ctx->target) + opt->offset) =
                strtof (argument, &endptr);
            if (endptr == argument || *endptr != 0) {
                nn_option_error ("requires float point argument",
                                ctx, opt_index);
            }
#endif
            return;
        case NN_OPT_LIST_APPEND:
            nn_append_string (ctx, opt, argument);
            return;
        case NN_OPT_LIST_APPEND_FMT:
            data_buf = strlen (argument) + strlen (opt->pointer);
            data = malloc (data_buf);
#if defined NN_HAVE_WINDOWS
            data_len = _snprintf_s (data, data_buf, _TRUNCATE, opt->pointer,
                argument);
#else
            data_len = snprintf (data, data_buf, opt->pointer, argument);
#endif
            assert (data_len < data_buf);
            nn_append_string (ctx, opt, data);
            nn_append_string_to_free (ctx, opt, data);
            return;
        case NN_OPT_READ_FILE:
            if (!strcmp (argument, "-")) {
                file = stdin;
            } else {
                file = fopen (argument, "r");
                if (!file) {
                    fprintf (stderr, "Error opening file ``%s'': %s\n",
                        argument, strerror (errno));
                    exit (2);
                }
            }
            data = malloc (4096);
            if (!data)
                nn_memory_error (ctx);
            data_len = 0;
            data_buf = 4096;
            for (;;) {
                bytes_read = fread (data + data_len, 1, data_buf - data_len,
                                   file);
                data_len += bytes_read;
                if (feof (file))
                    break;
                if (data_buf - data_len < 1024) {
                    if (data_buf < (1 << 20)) {
                        data_buf *= 2;  /* grow twice until not too big */
                    } else {
                        data_buf += 1 << 20;  /* grow 1 Mb each time */
                    }
                    data = realloc (data, data_buf);
                    if (!data)
                        nn_memory_error (ctx);
                }
            }
            if (data_len != data_buf) {
                data = realloc (data, data_len);
                assert (data);
            }
            if (ferror (file)) {
#if defined _MSC_VER
#pragma warning (push)
#pragma warning (disable:4996)
#endif
                fprintf (stderr, "Error reading file ``%s'': %s\n",
                    argument, strerror (errno));
#if defined _MSC_VER
#pragma warning (pop)
#endif
                exit (2);
            }
            if (file != stdin) {
                fclose (file);
            }
            blob = (struct nn_blob *)(((char *)ctx->target) + opt->offset);
            blob->data = data;
            blob->length = data_len;
            blob->need_free = 1;
            return;
    }
    abort ();
}